

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

int __thiscall duckdb_re2::Regexp::NumCaptures(Regexp *this)

{
  int iVar1;
  NumCapturesWalker w;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  NumCapturesWalker *this_00;
  NumCapturesWalker local_70;
  
  this_00 = &local_70;
  NumCapturesWalker::NumCapturesWalker(this_00);
  Walker<int>::Walk(&this_00->super_Walker<int>,
                    (Regexp *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  iVar1 = NumCapturesWalker::ncapture(&local_70);
  NumCapturesWalker::~NumCapturesWalker((NumCapturesWalker *)0x25ff748);
  return iVar1;
}

Assistant:

int Regexp::NumCaptures() {
  NumCapturesWalker w;
  w.Walk(this, 0);
  return w.ncapture();
}